

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

LogicalType *
duckdb::LogicalType::NormalizeType(LogicalType *__return_storage_ptr__,LogicalType *type)

{
  LogicalTypeId LVar1;
  element_type *in_RAX;
  ParameterNotResolvedException *this;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_18;
  
  LVar1 = type->id_;
  if (LVar1 == STRING_LITERAL) {
    LogicalType(__return_storage_ptr__,VARCHAR);
  }
  else {
    if (LVar1 == INTEGER_LITERAL) {
      local_18.ptr = (type->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_18);
      type = (LogicalType *)(local_18.ptr + 1);
    }
    else {
      local_18.ptr = in_RAX;
      if (LVar1 == UNKNOWN) {
        this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this);
        __cxa_throw(this,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
    }
    LogicalType(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::NormalizeType(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::STRING_LITERAL:
		return LogicalType::VARCHAR;
	case LogicalTypeId::INTEGER_LITERAL:
		return IntegerLiteral::GetType(type);
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	default:
		return type;
	}
}